

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::ParseContext::ReadSizeAndPushLimitAndDepth
          (ParseContext *this,char *ptr,int *old_limit)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  uint limit;
  char *ptr_00;
  pair<const_char_*,_int> pVar4;
  
  bVar1 = *ptr;
  limit = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar4 = ReadSizeFallback(ptr,(uint)bVar1);
    limit = pVar4.second;
    ptr_00 = pVar4.first;
  }
  else {
    ptr_00 = ptr + 1;
  }
  if (ptr_00 == (char *)0x0) {
    *old_limit = 0;
    pcVar3 = (char *)0x0;
  }
  else {
    iVar2 = EpsCopyInputStream::PushLimit(&this->super_EpsCopyInputStream,ptr_00,limit);
    *old_limit = iVar2;
    iVar2 = this->depth_;
    this->depth_ = iVar2 + -1;
    pcVar3 = (char *)0x0;
    if (0 < iVar2) {
      pcVar3 = ptr_00;
    }
  }
  return pcVar3;
}

Assistant:

const char* ParseContext::ReadSizeAndPushLimitAndDepth(const char* ptr,
                                                       int* old_limit) {
  int size = ReadSize(&ptr);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) {
    *old_limit = 0;  // Make sure this isn't uninitialized even on error return
    return nullptr;
  }
  *old_limit = PushLimit(ptr, size);
  if (--depth_ < 0) return nullptr;
  return ptr;
}